

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m256i *palVar13;
  __m256i *ptr;
  __m256i *ptr_00;
  int64_t *ptr_01;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  undefined8 uVar46;
  int iVar47;
  __m256i *palVar48;
  ulong uVar49;
  uint uVar50;
  ulong size;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar75 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  int local_22c;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar58 [64];
  undefined1 auVar84 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sg_flags_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_1();
        }
        else {
          iVar9 = uVar1 - 1;
          size = (ulong)uVar1 + 3 >> 2;
          uVar50 = (uint)size;
          iVar10 = iVar9 / (int)uVar50;
          uVar25 = iVar9 % (int)uVar50;
          uVar22 = (ulong)(uint)open;
          iVar47 = -open;
          iVar20 = ppVar3->min;
          uVar32 = 0x8000000000000000 - (long)iVar20;
          if (iVar20 != iVar47 && SBORROW4(iVar20,iVar47) == iVar20 + open < 0) {
            uVar32 = uVar22 | 0x8000000000000000;
          }
          iVar20 = ppVar3->max;
          ppVar12 = parasail_result_new();
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x4800802;
            palVar13 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar13 != (__m256i *)0x0)) {
              iVar11 = s2Len + -1;
              iVar19 = 3 - iVar10;
              auVar87 = ZEXT2864(CONCAT424(open,CONCAT420(0,CONCAT416(open,CONCAT412(0,CONCAT48(open
                                                  ,uVar22))))));
              uVar29 = (ulong)(uint)gap;
              auVar78 = ZEXT2864(CONCAT424(gap,CONCAT420(0,CONCAT416(gap,CONCAT412(0,CONCAT48(gap,
                                                  uVar29))))));
              lVar45 = uVar32 + 1;
              lVar27 = 0x7ffffffffffffffe - (long)iVar20;
              auVar82._8_8_ = lVar27;
              auVar82._0_8_ = lVar27;
              auVar82._16_8_ = lVar27;
              auVar82._24_8_ = lVar27;
              auVar84 = ZEXT3264(auVar82);
              lVar27 = (long)iVar47;
              uVar32 = 0;
              do {
                lVar37 = 0;
                lVar34 = lVar27;
                do {
                  lVar40 = lVar34;
                  if (s1_beg != 0) {
                    lVar40 = 0;
                  }
                  local_80[lVar37] = lVar40;
                  local_a0[lVar37] = lVar40 - uVar22;
                  lVar37 = lVar37 + 1;
                  lVar34 = lVar34 - size * uVar29;
                } while (lVar37 != 4);
                palVar48 = palVar13 + uVar32;
                (*palVar48)[0] = local_80[0];
                (*palVar48)[1] = local_80[1];
                (*palVar48)[2] = local_80[2];
                (*palVar48)[3] = local_80[3];
                palVar48 = ptr_00 + uVar32;
                (*palVar48)[0] = local_a0[0];
                (*palVar48)[1] = local_a0[1];
                (*palVar48)[2] = local_a0[2];
                (*palVar48)[3] = local_a0[3];
                uVar32 = uVar32 + 1;
                lVar27 = lVar27 - uVar29;
              } while (uVar32 != size);
              *ptr_01 = 0;
              uVar32 = 1;
              iVar20 = iVar47;
              do {
                iVar26 = 0;
                if (s2_beg == 0) {
                  iVar26 = iVar20;
                }
                ptr_01[uVar32] = (long)iVar26;
                uVar32 = uVar32 + 1;
                iVar20 = iVar20 - gap;
              } while (s2Len + 1 != uVar32);
              uVar32 = 1;
              if (1 < s2Len) {
                uVar32 = (ulong)(uint)s2Len;
              }
              lVar27 = (ulong)(uVar50 + (uVar50 == 0)) << 5;
              uVar29 = 0;
              auVar57._0_8_ = -(ulong)(iVar19 == 3);
              auVar57._8_8_ = -(ulong)(iVar19 == 2);
              auVar57._16_8_ = -(ulong)(iVar19 == 1);
              auVar57._24_8_ = -(ulong)(iVar19 == 0);
              auVar58 = ZEXT3264(auVar57);
              auVar4._8_8_ = lVar45;
              auVar4._0_8_ = lVar45;
              auVar4._16_8_ = lVar45;
              auVar4._24_8_ = lVar45;
              auVar90 = ZEXT3264(auVar4);
              auVar75 = ZEXT3264(auVar4);
              local_22c = iVar11;
              do {
                palVar48 = ptr;
                ptr = palVar13;
                auVar60 = SUB3216(ptr[uVar50 - 1],0);
                auVar92._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar58._0_16_;
                auVar92._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar60;
                auVar4 = vpalignr_avx2((undefined1  [32])ptr[uVar50 - 1],auVar92,8);
                iVar20 = ppVar3->mapper[(byte)s2[uVar29]];
                auVar4 = vpblendd_avx2(auVar4,ZEXT832((ulong)ptr_01[uVar29]),3);
                lVar34 = 0;
                auVar58 = ZEXT3264(CONCAT824(lVar45,CONCAT816(lVar45,CONCAT88(lVar45,lVar45))));
                do {
                  auVar4 = vpaddq_avx2(auVar4,*(undefined1 (*) [32])
                                               ((long)pvVar2 + lVar34 + size * (long)iVar20 * 0x20))
                  ;
                  uVar17 = *(ulong *)((long)*ptr_00 + lVar34);
                  uVar18 = auVar4._0_8_;
                  if ((long)auVar4._0_8_ <= (long)uVar17) {
                    uVar18 = uVar17;
                  }
                  uVar24 = *(ulong *)((long)*ptr_00 + lVar34 + 8);
                  uVar35 = vpextrq_avx(auVar4._0_16_,1);
                  if ((long)uVar35 <= (long)uVar24) {
                    uVar35 = uVar24;
                  }
                  uVar28 = *(ulong *)((long)*ptr_00 + lVar34 + 0x10);
                  uVar44 = auVar4._16_8_;
                  if ((long)auVar4._16_8_ <= (long)uVar28) {
                    uVar44 = uVar28;
                  }
                  uVar39 = *(ulong *)((long)*ptr_00 + lVar34 + 0x18);
                  uVar30 = vpextrq_avx(auVar4._16_16_,1);
                  if ((long)uVar30 <= (long)uVar39) {
                    uVar30 = uVar39;
                  }
                  uVar43 = auVar58._0_8_;
                  if ((long)uVar18 <= (long)uVar43) {
                    uVar18 = uVar43;
                  }
                  uVar14 = vpextrq_avx(auVar58._0_16_,1);
                  if ((long)uVar35 <= (long)uVar14) {
                    uVar35 = uVar14;
                  }
                  uVar59 = auVar58._16_8_;
                  if ((long)uVar44 <= (long)uVar59) {
                    uVar44 = uVar59;
                  }
                  uVar15 = vpextrq_avx(auVar58._16_16_,1);
                  if ((long)uVar30 <= (long)uVar15) {
                    uVar30 = uVar15;
                  }
                  uVar38 = auVar90._0_8_;
                  if ((long)auVar90._0_8_ <= (long)uVar18) {
                    uVar38 = uVar18;
                  }
                  uVar33 = vpextrq_avx(auVar90._0_16_,1);
                  if ((long)uVar33 <= (long)uVar35) {
                    uVar33 = uVar35;
                  }
                  uVar23 = auVar90._16_8_;
                  if ((long)auVar90._16_8_ <= (long)uVar44) {
                    uVar23 = uVar44;
                  }
                  uVar16 = vpextrq_avx(auVar90._16_16_,1);
                  if ((long)uVar16 <= (long)uVar30) {
                    uVar16 = uVar30;
                  }
                  uVar49 = uVar18;
                  if ((long)auVar84._0_8_ < (long)uVar18) {
                    uVar49 = auVar84._0_8_;
                  }
                  uVar41 = vpextrq_avx(auVar84._0_16_,1);
                  uVar36 = uVar35;
                  if ((long)uVar41 < (long)uVar35) {
                    uVar36 = uVar41;
                  }
                  uVar41 = uVar44;
                  if ((long)auVar84._16_8_ < (long)uVar44) {
                    uVar41 = auVar84._16_8_;
                  }
                  uVar42 = vpextrq_avx(auVar84._16_16_,1);
                  uVar31 = uVar30;
                  if ((long)uVar42 < (long)uVar30) {
                    uVar31 = uVar42;
                  }
                  if ((long)uVar17 <= (long)uVar49) {
                    uVar49 = uVar17;
                  }
                  if ((long)uVar24 <= (long)uVar36) {
                    uVar36 = uVar24;
                  }
                  if ((long)uVar28 <= (long)uVar41) {
                    uVar41 = uVar28;
                  }
                  if ((long)uVar39 <= (long)uVar31) {
                    uVar31 = uVar39;
                  }
                  if ((long)uVar43 <= (long)uVar49) {
                    uVar49 = uVar43;
                  }
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = uVar44;
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = uVar30;
                  auVar60 = vpunpcklqdq_avx(auVar60,auVar97);
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar35;
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar18;
                  auVar61 = vpunpcklqdq_avx(auVar76,auVar61);
                  auVar96._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61;
                  auVar96._16_16_ = ZEXT116(1) * auVar60;
                  if ((long)uVar14 <= (long)uVar36) {
                    uVar36 = uVar14;
                  }
                  if ((long)uVar59 <= (long)uVar41) {
                    uVar41 = uVar59;
                  }
                  if ((long)uVar15 <= (long)uVar31) {
                    uVar31 = uVar15;
                  }
                  auVar86 = auVar87._0_32_;
                  auVar4 = vpsubq_avx2(auVar96,auVar86);
                  auVar77 = auVar78._0_32_;
                  auVar92 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr_00 + lVar34),auVar77);
                  uVar17 = auVar4._0_8_;
                  uVar18 = auVar92._0_8_;
                  if ((long)auVar92._0_8_ <= (long)uVar17) {
                    uVar18 = uVar17;
                  }
                  uVar35 = vpextrq_avx(auVar92._0_16_,1);
                  uVar24 = vpextrq_avx(auVar4._0_16_,1);
                  if ((long)uVar35 <= (long)uVar24) {
                    uVar35 = uVar24;
                  }
                  uVar28 = auVar4._16_8_;
                  uVar44 = auVar92._16_8_;
                  if ((long)auVar92._16_8_ <= (long)uVar28) {
                    uVar44 = uVar28;
                  }
                  uVar30 = vpextrq_avx(auVar92._16_16_,1);
                  uVar39 = vpextrq_avx(auVar4._16_16_,1);
                  if ((long)uVar30 <= (long)uVar39) {
                    uVar30 = uVar39;
                  }
                  auVar4 = vpsubq_avx2(auVar58._0_32_,auVar77);
                  if ((long)uVar17 < (long)auVar4._0_8_) {
                    uVar17 = auVar4._0_8_;
                  }
                  uVar43 = vpextrq_avx(auVar4._0_16_,1);
                  if ((long)uVar24 < (long)uVar43) {
                    uVar24 = uVar43;
                  }
                  if ((long)uVar28 < (long)auVar4._16_8_) {
                    uVar28 = auVar4._16_8_;
                  }
                  uVar43 = vpextrq_avx(auVar4._16_16_,1);
                  if ((long)uVar39 < (long)uVar43) {
                    uVar39 = uVar43;
                  }
                  *(undefined1 (*) [32])((long)*palVar48 + lVar34) = auVar96;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = uVar23;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = uVar16;
                  auVar60 = vpunpcklqdq_avx(auVar7,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = uVar33;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar38;
                  auVar61 = vpunpcklqdq_avx(auVar88,auVar6);
                  auVar90 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                ZEXT116(1) * auVar60,
                                                ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61));
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = uVar31;
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar41;
                  auVar60 = vpunpcklqdq_avx(auVar99,auVar93);
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar36;
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = uVar49;
                  auVar61 = vpunpcklqdq_avx(auVar100,auVar81);
                  auVar84 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                ZEXT116(1) * auVar60,
                                                ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61));
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar18;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar35;
                  auVar60 = vpunpcklqdq_avx(auVar52,auVar62);
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar30;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = uVar44;
                  auVar61 = vpunpcklqdq_avx(auVar91,auVar85);
                  auVar87 = ZEXT3264(auVar86);
                  auVar78 = ZEXT3264(auVar77);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar34 + 0x10) = auVar61;
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar34) = auVar60;
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = uVar28;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar39;
                  auVar60 = vpunpcklqdq_avx(auVar69,auVar79);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar24;
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = uVar17;
                  auVar61 = vpunpcklqdq_avx(auVar98,auVar95);
                  auVar58 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar60,
                                                ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61));
                  auVar4 = *(undefined1 (*) [32])((long)*ptr + lVar34);
                  lVar34 = lVar34 + 0x20;
                } while (lVar27 != lVar34);
                uVar21 = 0;
                do {
                  uVar17 = (long)iVar47;
                  if (s2_beg == 0) {
                    uVar17 = ptr_01[uVar29 + 1] - uVar22;
                  }
                  auVar4 = vpermq_avx2(auVar58._0_32_,0x90);
                  auVar4 = vpblendd_avx2(auVar4,ZEXT832(uVar17),3);
                  auVar58 = ZEXT3264(auVar4);
                  bVar51 = true;
                  uVar17 = 1;
                  lVar34 = 0;
                  do {
                    uVar18 = *(ulong *)((long)*palVar48 + lVar34);
                    uVar24 = auVar58._0_8_;
                    if ((long)auVar58._0_8_ < (long)uVar18) {
                      uVar24 = uVar18;
                    }
                    uVar35 = vpextrq_avx(auVar58._0_16_,1);
                    uVar18 = *(ulong *)((long)*palVar48 + lVar34 + 8);
                    if ((long)uVar35 < (long)uVar18) {
                      uVar35 = uVar18;
                    }
                    uVar18 = *(ulong *)((long)*palVar48 + lVar34 + 0x10);
                    uVar28 = auVar58._16_8_;
                    if ((long)auVar58._16_8_ < (long)uVar18) {
                      uVar28 = uVar18;
                    }
                    uVar44 = vpextrq_avx(auVar58._16_16_,1);
                    uVar18 = *(ulong *)((long)*palVar48 + lVar34 + 0x18);
                    if ((long)uVar44 < (long)uVar18) {
                      uVar44 = uVar18;
                    }
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = uVar44;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = uVar28;
                    auVar60 = vpunpcklqdq_avx(auVar63,auVar53);
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = uVar35;
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar24;
                    auVar61 = vpunpcklqdq_avx(auVar70,auVar64);
                    auVar94._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61;
                    auVar94._16_16_ = ZEXT116(1) * auVar60;
                    *(undefined1 (*) [32])((long)*palVar48 + lVar34) = auVar94;
                    uVar18 = auVar84._0_8_;
                    if ((long)uVar24 <= (long)auVar84._0_8_) {
                      uVar18 = uVar24;
                    }
                    uVar39 = vpextrq_avx(auVar84._0_16_,1);
                    if ((long)uVar35 <= (long)uVar39) {
                      uVar39 = uVar35;
                    }
                    uVar30 = auVar84._16_8_;
                    if ((long)uVar28 <= (long)auVar84._16_8_) {
                      uVar30 = uVar28;
                    }
                    uVar43 = vpextrq_avx(auVar84._16_16_,1);
                    if ((long)uVar44 <= (long)uVar43) {
                      uVar43 = uVar44;
                    }
                    if ((long)uVar24 < (long)auVar90._0_8_) {
                      uVar24 = auVar90._0_8_;
                    }
                    uVar14 = vpextrq_avx(auVar90._0_16_,1);
                    if ((long)uVar35 < (long)uVar14) {
                      uVar35 = uVar14;
                    }
                    if ((long)uVar28 < (long)auVar90._16_8_) {
                      uVar28 = auVar90._16_8_;
                    }
                    uVar14 = vpextrq_avx(auVar90._16_16_,1);
                    if ((long)uVar14 <= (long)uVar44) {
                      uVar14 = uVar44;
                    }
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = uVar43;
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = uVar30;
                    auVar60 = vpunpcklqdq_avx(auVar65,auVar54);
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar39;
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar18;
                    auVar61 = vpunpcklqdq_avx(auVar71,auVar66);
                    auVar83._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61;
                    auVar83._16_16_ = ZEXT116(1) * auVar60;
                    auVar84._0_32_ = auVar83;
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar14;
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar28;
                    auVar60 = vpunpcklqdq_avx(auVar67,auVar55);
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar35;
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = uVar24;
                    auVar61 = vpunpcklqdq_avx(auVar72,auVar68);
                    auVar89._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61;
                    auVar89._16_16_ = ZEXT116(1) * auVar60;
                    auVar90._0_32_ = auVar89;
                    auVar4 = vpsubq_avx2(auVar94,auVar86);
                    auVar92 = vpsubq_avx2(auVar58._0_32_,auVar77);
                    auVar58 = ZEXT3264(auVar92);
                    auVar4 = vpcmpgtq_avx2(auVar92,auVar4);
                    if ((((auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar4 >> 0x7f,0) == '\0') && SUB321(auVar4 >> 0xbf,0) == '\0') &&
                        -1 < auVar4[0x1f]) break;
                    bVar51 = uVar17 < size;
                    lVar34 = lVar34 + 0x20;
                    uVar17 = uVar17 + 1;
                  } while (lVar27 != lVar34);
                } while ((!bVar51) && (bVar51 = uVar21 < 3, uVar21 = uVar21 + 1, bVar51));
                auVar4 = vpcmpgtq_avx2((undefined1  [32])palVar48[uVar25],auVar75._0_32_);
                uVar17 = auVar75._0_8_;
                if ((long)auVar75._0_8_ < palVar48[uVar25][0]) {
                  uVar17 = palVar48[uVar25][0];
                }
                uVar18 = vpextrq_avx(auVar75._0_16_,1);
                if ((long)uVar18 < palVar48[uVar25][1]) {
                  uVar18 = palVar48[uVar25][1];
                }
                uVar24 = auVar75._16_8_;
                if ((long)auVar75._16_8_ < palVar48[uVar25][2]) {
                  uVar24 = palVar48[uVar25][2];
                }
                uVar35 = vpextrq_avx(auVar75._16_16_,1);
                if ((long)uVar35 < palVar48[uVar25][3]) {
                  uVar35 = palVar48[uVar25][3];
                }
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar35;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = uVar24;
                auVar60 = vpunpcklqdq_avx(auVar73,auVar56);
                auVar58 = ZEXT1664(auVar60);
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar18;
                auVar80._8_8_ = 0;
                auVar80._0_8_ = uVar17;
                auVar61 = vpunpcklqdq_avx(auVar80,auVar74);
                auVar76 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar60;
                auVar75 = ZEXT3264(CONCAT1616(auVar76,ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61));
                auVar4 = auVar57 & auVar4;
                if ((((auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar4 >> 0x7f,0) != '\0') || SUB321(auVar4 >> 0xbf,0) != '\0') ||
                    auVar4[0x1f] < '\0') {
                  local_22c = (int)uVar29;
                }
                uVar29 = uVar29 + 1;
                palVar13 = palVar48;
                if (uVar29 == uVar32) {
                  lVar27 = lVar45;
                  if (s2_end != 0) {
                    if (iVar10 < 3) {
                      iVar20 = 1;
                      if (1 < iVar19) {
                        iVar20 = iVar19;
                      }
                      do {
                        auVar57 = auVar75._0_32_;
                        auVar4 = vperm2i128_avx2(auVar57,auVar57,8);
                        auVar4 = vpalignr_avx2(auVar57,auVar4,8);
                        auVar76 = auVar4._16_16_;
                        auVar75 = ZEXT3264(auVar4);
                        iVar20 = iVar20 + -1;
                      } while (iVar20 != 0);
                    }
                    lVar27 = vpextrq_avx(auVar76,1);
                  }
                  iVar20 = iVar9;
                  if ((s1_end != 0) && (((ulong)uVar1 + 3 & 0x7ffffffc) != 0)) {
                    uVar32 = 0;
                    lVar34 = lVar27;
                    do {
                      iVar47 = ((uint)uVar32 & 3) * uVar50 + ((uint)(uVar32 >> 2) & 0x3fffffff);
                      lVar27 = lVar34;
                      iVar26 = iVar20;
                      iVar8 = local_22c;
                      if ((iVar47 < (int)uVar1) &&
                         (lVar27 = (*palVar48)[uVar32], iVar26 = iVar47, iVar8 = iVar11,
                         lVar27 <= lVar34)) {
                        if (iVar20 <= iVar47) {
                          iVar47 = iVar20;
                        }
                        if (local_22c != iVar11) {
                          iVar47 = iVar20;
                        }
                        bVar51 = lVar27 == lVar34;
                        lVar27 = lVar34;
                        iVar26 = iVar20;
                        iVar8 = local_22c;
                        if (bVar51) {
                          iVar26 = iVar47;
                        }
                      }
                      local_22c = iVar8;
                      iVar20 = iVar26;
                      uVar32 = uVar32 + 1;
                      lVar34 = lVar27;
                    } while ((uVar50 & 0x1fffffff) << 2 != (int)uVar32);
                  }
                  iVar47 = (int)lVar27;
                  if (s2_end == 0 && s1_end == 0) {
                    auVar60 = SUB3216(palVar48[uVar25],0x10);
                    auVar78 = ZEXT3264((undefined1  [32])palVar48[uVar25]);
                    if (iVar10 < 3) {
                      iVar20 = 1;
                      if (1 < iVar19) {
                        iVar20 = iVar19;
                      }
                      do {
                        auVar57 = auVar78._0_32_;
                        auVar4 = vperm2i128_avx2(auVar57,auVar57,8);
                        auVar4 = vpalignr_avx2(auVar57,auVar4,8);
                        auVar60 = auVar4._16_16_;
                        auVar78 = ZEXT3264(auVar4);
                        iVar20 = iVar20 + -1;
                      } while (iVar20 != 0);
                    }
                    uVar46 = vpextrq_avx(auVar60,1);
                    iVar47 = (int)uVar46;
                    iVar20 = iVar9;
                    local_22c = iVar11;
                  }
                  auVar77._8_8_ = lVar45;
                  auVar77._0_8_ = lVar45;
                  auVar77._16_8_ = lVar45;
                  auVar77._24_8_ = lVar45;
                  auVar4 = vpcmpgtq_avx2(auVar77,auVar83);
                  auVar82 = vpcmpgtq_avx2(auVar89,auVar82);
                  auVar82 = vpor_avx2(auVar82,auVar4);
                  if ((((auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar82 >> 0x7f,0) != '\0') || SUB321(auVar82 >> 0xbf,0) != '\0') ||
                      auVar82[0x1f] < '\0') {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    iVar47 = 0;
                    local_22c = 0;
                    iVar20 = 0;
                  }
                  ppVar12->score = iVar47;
                  ppVar12->end_query = iVar20;
                  ppVar12->end_ref = local_22c;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(palVar48);
                  return ppVar12;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}